

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cpp
# Opt level: O1

void __thiscall asl::Date::Date(Date *this,String *t)

{
  Date *pDVar1;
  uint uVar2;
  int iVar3;
  anon_union_16_2_78e7fdac_for_String_2 *paVar4;
  Map<asl::String,_int> *pMVar5;
  int x_9;
  uint uVar6;
  int iVar7;
  int x_8;
  uint m;
  int x_4;
  Zone z;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  long lVar11;
  int x;
  uint uVar12;
  long lVar13;
  int x_1;
  int iVar14;
  int x_2;
  int m_00;
  ulong uVar15;
  ulong uVar16;
  int x_3;
  int s;
  int x_7;
  uint h;
  int x_5;
  uint month;
  int x_6;
  uint day;
  bool bVar17;
  byte *local_1b8;
  double local_1b0;
  Array<asl::String> parts;
  Array<asl::Map<asl::String,_int>::KeyVal> local_1a0 [2];
  ulong local_190;
  Date *local_188;
  String local_180;
  String local_168;
  String local_150;
  String local_138;
  String local_120;
  String local_108;
  String local_f0;
  String local_d8;
  String local_c0;
  String local_a8;
  String local_90;
  String local_78;
  int local_60 [12];
  
  if (nan()::n == '\0') {
    asl::Date();
  }
  this->_t = (double)nan()::n;
  paVar4 = &t->field_2;
  if (t->_size != 0) {
    paVar4 = (anon_union_16_2_78e7fdac_for_String_2 *)(t->field_2)._str;
  }
  if ((byte)(paVar4->_space[0] + 0xbeU) < 0x18) {
    String::split((String *)&parts);
    if (5 < *(int *)&parts._a[-1].field_2) {
      if ((Date(asl::String_const&)::months == '\0') &&
         (iVar3 = __cxa_guard_acquire(&Date(asl::String_const&)::months), iVar3 != 0)) {
        String::String(&local_78,"Jan");
        local_60[0xb] = 1;
        Map<asl::String,_int>::Map((Map<asl::String,_int> *)local_1a0,&local_78,local_60 + 0xb);
        String::String(&local_90,"Feb");
        local_60[10] = 2;
        pMVar5 = Map<asl::String,_int>::set
                           ((Map<asl::String,_int> *)local_1a0,&local_90,local_60 + 10);
        String::String(&local_a8,"Mar");
        local_60[9] = 3;
        pMVar5 = Map<asl::String,_int>::set(pMVar5,&local_a8,local_60 + 9);
        String::String(&local_c0,"Apr");
        local_60[8] = 4;
        pMVar5 = Map<asl::String,_int>::set(pMVar5,&local_c0,local_60 + 8);
        String::String(&local_d8,"May");
        local_60[7] = 5;
        pMVar5 = Map<asl::String,_int>::set(pMVar5,&local_d8,local_60 + 7);
        String::String(&local_f0,"Jun");
        local_60[6] = 6;
        pMVar5 = Map<asl::String,_int>::set(pMVar5,&local_f0,local_60 + 6);
        String::String(&local_108,"Jul");
        local_60[5] = 7;
        pMVar5 = Map<asl::String,_int>::set(pMVar5,&local_108,local_60 + 5);
        String::String(&local_120,"Aug");
        local_60[4] = 8;
        pMVar5 = Map<asl::String,_int>::set(pMVar5,&local_120,local_60 + 4);
        String::String(&local_138,"Sep");
        local_60[3] = 9;
        pMVar5 = Map<asl::String,_int>::set(pMVar5,&local_138,local_60 + 3);
        String::String(&local_150,"Oct");
        local_60[2] = 10;
        pMVar5 = Map<asl::String,_int>::set(pMVar5,&local_150,local_60 + 2);
        String::String(&local_168,"Nov");
        local_60[1] = 0xb;
        pMVar5 = Map<asl::String,_int>::set(pMVar5,&local_168,local_60 + 1);
        String::String(&local_180,"Dec");
        local_60[0] = 0xc;
        pMVar5 = Map<asl::String,_int>::set(pMVar5,&local_180,local_60);
        Date::months.a._a = (Array<asl::Map<asl::String,_int>::KeyVal>)(pMVar5->a)._a;
        LOCK();
        ((KeyVal *)((long)Date::months.a._a + -0x20))->value =
             ((KeyVal *)((long)Date::months.a._a + -0x20))->value + 1;
        UNLOCK();
        if (local_180._size != 0) {
          free(local_180.field_2._str);
        }
        if (local_168._size != 0) {
          free(local_168.field_2._str);
        }
        if (local_150._size != 0) {
          free(local_150.field_2._str);
        }
        if (local_138._size != 0) {
          free(local_138.field_2._str);
        }
        if (local_120._size != 0) {
          free(local_120.field_2._str);
        }
        if (local_108._size != 0) {
          free(local_108.field_2._str);
        }
        if (local_f0._size != 0) {
          free(local_f0.field_2._str);
        }
        if (local_d8._size != 0) {
          free(local_d8.field_2._str);
        }
        if (local_c0._size != 0) {
          free(local_c0.field_2._str);
        }
        if (local_a8._size != 0) {
          free(local_a8.field_2._str);
        }
        if (local_90._size != 0) {
          free(local_90.field_2._str);
        }
        Array<asl::Map<asl::String,_int>::KeyVal>::~Array(local_1a0);
        if (local_78._size != 0) {
          free(local_78.field_2._str);
        }
        __cxa_atexit(Map<asl::String,_int>::~Map,&Date::months,&__dso_handle);
        __cxa_guard_release(&Date(asl::String_const&)::months);
      }
      uVar2 = Map<asl::String,_int>::indexOf(&Date::months,parts._a + 2);
      if ((int)uVar2 < 0) {
        iVar3 = 0;
      }
      else {
        iVar3 = *(int *)((long)Date::months.a._a + 0x18 + (ulong)uVar2 * 0x20);
      }
      if (parts._a[1]._size == 0) {
        paVar4 = &parts._a[1].field_2;
      }
      else {
        paVar4 = (anon_union_16_2_78e7fdac_for_String_2 *)parts._a[1].field_2._str;
      }
      uVar2 = 0;
      iVar7 = 1;
      uVar10 = 3;
      do {
        if (9 < (byte)(paVar4->_space[uVar10 - 2] - 0x30U)) {
          uVar2 = 0xfff0bdc0;
          break;
        }
        uVar2 = uVar2 + ((byte)paVar4->_space[uVar10 - 2] - 0x30) * iVar7;
        iVar7 = iVar7 * 10;
        uVar10 = uVar10 - 1;
      } while (1 < uVar10);
      if (parts._a[3]._size == 0) {
        paVar4 = &parts._a[3].field_2;
      }
      else {
        paVar4 = (anon_union_16_2_78e7fdac_for_String_2 *)parts._a[3].field_2._str;
      }
      if ((long)parts._a[3]._len < 1) {
        uVar6 = 0;
      }
      else {
        lVar11 = (long)parts._a[3]._len + 1;
        uVar6 = 0;
        iVar7 = 1;
        do {
          if (9 < (byte)(paVar4->_space[lVar11 + -2] - 0x30U)) {
            uVar6 = 0xfff0bdc0;
            break;
          }
          uVar6 = uVar6 + ((byte)paVar4->_space[lVar11 + -2] - 0x30) * iVar7;
          iVar7 = iVar7 * 10;
          lVar11 = lVar11 + -1;
        } while (1 < lVar11);
      }
      if ((iVar3 != 0) && (-1 < (int)(uVar6 | uVar2))) {
        if (parts._a[4]._size == 0) {
          paVar4 = &parts._a[4].field_2;
        }
        else {
          paVar4 = (anon_union_16_2_78e7fdac_for_String_2 *)parts._a[4].field_2._str;
        }
        if (((parts._a[4]._len == 8) && (paVar4->_space[2] == ':')) && (paVar4->_space[5] == ':')) {
          iVar14 = 0;
          iVar7 = 1;
          uVar10 = 3;
          do {
            if (9 < (byte)(paVar4->_space[uVar10 - 2] - 0x30U)) {
              iVar14 = -1000000;
              break;
            }
            iVar14 = iVar14 + ((byte)paVar4->_space[uVar10 - 2] - 0x30) * iVar7;
            iVar7 = iVar7 * 10;
            uVar10 = uVar10 - 1;
          } while (1 < uVar10);
          m_00 = 0;
          iVar7 = 1;
          uVar10 = 3;
          do {
            if (9 < (byte)(paVar4->_space[uVar10 + 1] - 0x30U)) {
              m_00 = -1000000;
              break;
            }
            m_00 = m_00 + ((byte)paVar4->_space[uVar10 + 1] - 0x30) * iVar7;
            iVar7 = iVar7 * 10;
            uVar10 = uVar10 - 1;
          } while (1 < uVar10);
          s = 0;
          iVar7 = 1;
          uVar10 = 3;
          do {
            if (9 < (byte)(paVar4->_space[uVar10 + 4] - 0x30U)) {
              s = -1000000;
              break;
            }
            s = s + ((byte)paVar4->_space[uVar10 + 4] - 0x30) * iVar7;
            iVar7 = iVar7 * 10;
            uVar10 = uVar10 - 1;
          } while (1 < uVar10);
          construct(this,UTC,uVar6,iVar3,uVar2,iVar14,m_00,s);
        }
      }
    }
    Array<asl::String>::~Array(&parts);
    return;
  }
  iVar3 = t->_len;
  if (((iVar3 < 10) || (paVar4->_space[4] != '-')) || (paVar4->_space[7] != '-')) {
    bVar9 = 1;
    if (iVar3 < 8) {
      return;
    }
  }
  else {
    bVar9 = 0;
  }
  uVar2 = 0;
  iVar7 = 1;
  uVar10 = 5;
  do {
    if (9 < (byte)(paVar4->_space[uVar10 - 2] - 0x30U)) {
      uVar2 = 0xfff0bdc0;
      break;
    }
    uVar2 = uVar2 + ((byte)paVar4->_space[uVar10 - 2] - 0x30) * iVar7;
    iVar7 = iVar7 * 10;
    uVar10 = uVar10 - 1;
  } while (1 < uVar10);
  uVar6 = bVar9 ^ 5;
  month = 0;
  iVar7 = 1;
  uVar10 = 3;
  do {
    if (9 < (byte)(paVar4->_space[uVar10 + ((ulong)uVar6 - 2)] - 0x30U)) {
      month = 0xfff0bdc0;
      break;
    }
    month = month + ((byte)paVar4->_space[uVar10 + ((ulong)uVar6 - 2)] - 0x30) * iVar7;
    iVar7 = iVar7 * 10;
    uVar10 = uVar10 - 1;
  } while (1 < uVar10);
  uVar10 = (ulong)((uint)(bVar9 ^ 1) * 2 + 6);
  day = 0;
  iVar7 = 1;
  uVar15 = 3;
  do {
    if (9 < (byte)(paVar4->_space[uVar15 + (ulong)((uint)(bVar9 ^ 1) * 2) + 4] - 0x30U)) {
      day = 0xfff0bdc0;
      break;
    }
    day = day + ((byte)paVar4->_space[uVar15 + (ulong)((uint)(bVar9 ^ 1) * 2) + 4] - 0x30) * iVar7;
    iVar7 = iVar7 * 10;
    uVar15 = uVar15 - 1;
  } while (1 < uVar15);
  if (bVar9 == 0) {
    if (iVar3 < 0x10) {
      return;
    }
LAB_001380cd:
    uVar12 = 0xb;
    if (paVar4->_space[10] != 'T') {
      return;
    }
  }
  else if ((iVar3 < 0xd) || (uVar12 = 9, paVar4->_space[8] != 'T')) {
    if (iVar3 < 0x10 || bVar9 != 0) {
      return;
    }
    goto LAB_001380cd;
  }
  if ((int)(month | uVar2 | day) < 0) {
    return;
  }
  iVar3 = iVar3 - uVar12;
  local_188 = this;
  if (iVar3 < (int)uVar6) {
    local_1b0 = 0.0;
    z = UTC;
    h = 0;
    m = 0;
    uVar6 = 0;
LAB_00138102:
    local_1b8._0_4_ = 0;
    goto LAB_00138109;
  }
  if (bVar9 == 0) {
    if (paVar4->_space[(ulong)uVar12 + 2] != ':') {
      return;
    }
    lVar13 = 3;
    lVar11 = 6;
    if (iVar3 < 8) goto LAB_001382da;
    bVar17 = paVar4->_space[(ulong)uVar12 + 5] == ':';
  }
  else {
    lVar13 = 2;
    lVar11 = 4;
    if (iVar3 < 6) {
LAB_001382da:
      bVar17 = false;
    }
    else {
      bVar17 = (byte)(paVar4->_space[(ulong)uVar12 + 4] - 0x30U) < 10;
    }
  }
  h = 0;
  iVar3 = 1;
  uVar15 = 3;
  do {
    if (9 < (byte)(paVar4->_space[uVar15 + ((ulong)uVar12 - 2)] - 0x30U)) {
      h = 0xfff0bdc0;
      break;
    }
    h = h + ((byte)paVar4->_space[uVar15 + ((ulong)uVar12 - 2)] - 0x30) * iVar3;
    iVar3 = iVar3 * 10;
    uVar15 = uVar15 - 1;
  } while (1 < uVar15);
  m = 0;
  iVar3 = 1;
  uVar15 = 3;
  do {
    if (9 < (byte)(paVar4->_space[uVar15 + lVar13 + (ulong)uVar12 + -2] - 0x30U)) {
      m = 0xfff0bdc0;
      break;
    }
    m = m + ((byte)paVar4->_space[uVar15 + lVar13 + (ulong)uVar12 + -2] - 0x30) * iVar3;
    iVar3 = iVar3 * 10;
    uVar15 = uVar15 - 1;
  } while (1 < uVar15);
  uVar16 = 0;
  uVar15 = (ulong)uVar6;
  if (bVar17) {
    uVar16 = 0;
    iVar3 = 1;
    uVar8 = 3;
    do {
      uVar15 = uVar10;
      if (9 < (byte)(paVar4->_space[uVar8 + lVar11 + (ulong)uVar12 + -2] - 0x30U)) {
        uVar16 = 0xfff0bdc0;
        break;
      }
      uVar16 = (ulong)((int)uVar16 +
                      ((byte)paVar4->_space[uVar8 + lVar11 + (ulong)uVar12 + -2] - 0x30) * iVar3);
      iVar3 = iVar3 * 10;
      uVar8 = uVar8 - 1;
    } while (1 < uVar8);
  }
  local_1b8 = (byte *)(paVar4->_space + uVar15 + uVar12);
  local_1b0 = 0.0;
  if (paVar4->_space[uVar15 + uVar12] == '.') {
    uVar6 = 0xffffffff;
    uVar10 = 0;
    do {
      lVar11 = uVar10 + 1;
      uVar6 = uVar6 + 1;
      uVar10 = uVar10 + 1;
    } while ((byte)(local_1b8[lVar11] - 0x30) < 10);
    local_1a0[1]._a = (KeyVal *)0x0;
    if (1 < uVar10) {
      lVar11 = (ulong)uVar6 + 1;
      iVar7 = 0;
      iVar3 = 1;
      do {
        if (9 < (byte)(local_1b8[lVar11 + -1] - 0x30)) {
          iVar7 = -1000000;
          break;
        }
        iVar7 = iVar7 + (local_1b8[lVar11 + -1] - 0x30) * iVar3;
        iVar3 = iVar3 * 10;
        lVar11 = lVar11 + -1;
      } while (1 < lVar11);
      local_1a0[1]._a = (KeyVal *)(double)iVar7;
    }
    local_1b8 = local_1b8 + uVar10;
    local_190 = uVar16;
    local_1b0 = pow(10.0,(double)(int)-uVar6);
    local_1b0 = local_1b0 * (double)local_1a0[1]._a;
    uVar16 = local_190;
  }
  uVar6 = (uint)uVar16;
  if (0x17 < h) {
    return;
  }
  if (0x3b < m) {
    return;
  }
  if (0x3b < uVar6) {
    return;
  }
  if (local_1b0 < 0.0) {
    return;
  }
  bVar9 = *local_1b8;
  if (bVar9 < 0x2d) {
    if (bVar9 == 0) {
      z = LOCAL;
      goto LAB_00138102;
    }
    if (bVar9 != 0x2b) {
      return;
    }
  }
  else {
    if (bVar9 == 0x5a) {
      z = UTC;
      goto LAB_00138102;
    }
    if (bVar9 != 0x2d) {
      return;
    }
  }
  iVar3 = (int)&t->field_2;
  if (t->_size != 0) {
    iVar3 = *(int *)&t->field_2;
  }
  iVar7 = (iVar3 + t->_len) - (int)local_1b8;
  iVar3 = 0;
  if (2 < iVar7) {
    iVar3 = 0;
    iVar14 = 1;
    uVar10 = 3;
    do {
      if (9 < (byte)(local_1b8[uVar10 - 1] - 0x30)) {
        iVar3 = -1000000;
        break;
      }
      iVar3 = iVar3 + (local_1b8[uVar10 - 1] - 0x30) * iVar14;
      iVar14 = iVar14 * 10;
      uVar10 = uVar10 - 1;
    } while (1 < uVar10);
    iVar3 = iVar3 * 0x3c;
  }
  if (iVar7 != 3) {
    if (iVar7 == 5) {
      iVar14 = 0;
      iVar7 = 1;
      uVar10 = 3;
      do {
        if (9 < (byte)(local_1b8[uVar10 + 1] - 0x30)) goto LAB_00138666;
        iVar14 = iVar14 + (local_1b8[uVar10 + 1] - 0x30) * iVar7;
        iVar7 = iVar7 * 10;
        uVar10 = uVar10 - 1;
      } while (1 < uVar10);
    }
    else {
      if ((iVar7 != 6) || (local_1b8[3] != 0x3a)) {
        iVar3 = -1000000;
        goto LAB_0013866d;
      }
      iVar14 = 0;
      iVar7 = 1;
      uVar10 = 3;
      do {
        if (9 < (byte)(local_1b8[uVar10 + 2] - 0x30)) goto LAB_00138666;
        iVar14 = iVar14 + (local_1b8[uVar10 + 2] - 0x30) * iVar7;
        iVar7 = iVar7 * 10;
        uVar10 = uVar10 - 1;
      } while (1 < uVar10);
    }
LAB_0013866b:
    iVar3 = iVar3 + iVar14;
  }
LAB_0013866d:
  local_1b8._0_4_ = -iVar3;
  if (iVar3 < -100000) {
    local_1b8._0_4_ = iVar3;
  }
  if (bVar9 != 0x2b) {
    local_1b8._0_4_ = iVar3;
  }
  if (iVar3 < -100000) {
    return;
  }
  z = UTC;
LAB_00138109:
  pDVar1 = local_188;
  construct(local_188,z,uVar2,month,day,h,m,uVar6);
  pDVar1->_t = (double)((int)local_1b8 * 0x3c) + local_1b0 + pDVar1->_t;
  return;
LAB_00138666:
  iVar14 = -1000000;
  goto LAB_0013866b;
}

Assistant:

Date::Date(const String& t)
{
	_t = nan();
	if (t[0] > 'A' && t[0] < 'Z') // HTTP like? "Thu, 18 May 2017 03:24:12 GMT"
	{
		Array<String> parts = t.split();
		if (parts.length() < 6)
			return;
		
		static Map<String, int> months = Map<String, int>("Jan", 1)("Feb", 2)(
		    "Mar", 3)("Apr", 4)("May", 5)("Jun", 6)("Jul", 7)("Aug", 8)("Sep", 9)("Oct", 10)("Nov", 11)("Dec", 12);
		
		int mo = months.get(parts[2], 0);
		int d = parseInt(parts[1], 2);
		int y = parseInt(parts[3], parts[3].length());
		if (mo == 0 || y < 0 || d < 0)
			return;
		const char* time = parts[4];
		if (parts[4].length() != 8 || time[2] != ':' || time[5] != ':')
			return;
		int h = parseInt(time, 2);
		int m = parseInt(time + 3, 2);
		int s = parseInt(time + 6, 2);
		construct(UTC, y, mo, d, h, m, s);
		return;
	}
	const char* p = t.data();
	int         y = -1, m = 1, d = 1;
	int         iTime = 0;
	bool        basic = true, local = false, hassecs = false;

	if (t.length() >= 10 && p[4] == '-' && p[7] == '-')
	{
		basic = false;
	}
	else if (t.length() < 8)
		return;

	y = parseInt(p + 0, 4);
	m = parseInt(p + (basic ? 4 : 5), 2);
	d = parseInt(p + (basic ? 6 : 8), 2);

	if (basic && t.length() > 12 && t[8] == 'T')
		iTime = 9;
	else if (!basic && t.length() > 15 && t[10] == 'T')
		iTime = 11;
	else
		return;

	if (y < 0 || m < 0 || d < 0)
		return;

	int    h = 0, mi = 0, s = 0, tz = 0;
	double ms = 0;

	if (iTime > 0)
		p = p + iTime;

	if (iTime > 0 && t.length() - iTime >= (basic ? 4 : 5)) // there is time
	{
		if (!basic) // ext
		{
			if (p[2] != ':')
				return;
			if (t.length() - iTime >= 8 && p[5] == ':')
				hassecs = true;
		}
		else // basic
		{
			if (t.length() - iTime >= 6 && myisdigit(p[4]))
				hassecs = true;
		}

		h = parseInt(p, 2);
		mi = parseInt(p + (basic ? 2 : 3), 2);
		s = parseInt(p + (basic ? 4 : 6), hassecs ? 2 : 0);
		p += hassecs ? (basic ? 6 : 8) : (basic ? 4 : 5);

		if (p[0] == '.') // have ms
		{
			int i = 1;
			while (myisdigit(p[i]))
				i++;
			ms = parseInt(p + 1, i - 1) * pow(10.0, 1-i);
			p += i;
		}

		if (h < 0 || h > 23 || mi < 0 || mi > 59 || s < 0 || s > 59 || ms < 0)
			return;

		if (p[0] == 'Z')
			tz = 0;
		else if (p[0] == '+' || p[0] == '-')
		{
			int n = int(t.data() + t.length() - p);
			if (n >= 3)
				tz = parseInt(p + 1, 2) * 60;
			if (n == 6 && p[3] == ':')
				tz += parseInt(p + 4, 2);
			else if (n == 5)
				tz += parseInt(p + 3, 2);
			else if (n != 3)
				tz = -1000000;

			if (tz < -100000)
				return;

			if (p[0] == '+')
				tz = -tz;
		}
		else if (p[0] == '\0')
			local = true;
		else
			return;
	}

	construct(local ? LOCAL : UTC, y, m, d, h, mi, s);

	_t += tz * 60 + ms;
}